

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O1

void __thiscall
ncnn::Crop::resolve_crop_roi
          (Crop *this,Mat *bottom_blob,int *_woffset,int *_hoffset,int *_doffset,int *_coffset,
          int *_outw,int *_outh,int *_outd,int *_outc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  int *piVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int local_48 [6];
  int _axes [4];
  
  uVar1 = bottom_blob->dims;
  uVar2 = bottom_blob->w;
  uVar3 = bottom_blob->h;
  uVar4 = bottom_blob->d;
  uVar5 = bottom_blob->c;
  pvVar6 = (this->starts).data;
  if ((((pvVar6 != (void *)0x0) && ((long)(this->starts).c * (this->starts).cstep != 0)) &&
      (pvVar7 = (this->ends).data, pvVar7 != (void *)0x0)) &&
     ((long)(this->ends).c * (this->ends).cstep != 0)) {
    *_woffset = 0;
    *_hoffset = 0;
    *_doffset = 0;
    *_coffset = 0;
    *_outw = uVar2;
    *_outh = uVar3;
    *_outd = uVar4;
    *_outc = uVar5;
    pvVar8 = (this->axes).data;
    local_48[0] = 0;
    local_48[1] = 1;
    local_48[2] = 2;
    local_48[3] = 3;
    uVar17 = (this->axes).w;
    uVar12 = uVar1;
    if (((ulong)uVar17 != 0) && (uVar12 = uVar17, 0 < (int)uVar17)) {
      uVar13 = 0;
      do {
        iVar16 = *(int *)((long)pvVar8 + uVar13 * 4);
        local_48[uVar13] = (iVar16 >> 0x1f & uVar1) + iVar16;
        uVar13 = uVar13 + 1;
      } while (uVar17 != uVar13);
    }
    if ((int)uVar12 < 1) {
      return;
    }
    uVar13 = 0;
    do {
      iVar16 = *(int *)((long)pvVar6 + uVar13 * 4);
      uVar17 = *(uint *)((long)pvVar7 + uVar13 * 4);
      if (uVar1 == 1) {
        if (iVar16 == -0xe9) {
          iVar16 = 0;
        }
        if (uVar17 == 0xffffff17) {
          uVar17 = uVar2;
        }
        iVar14 = (iVar16 >> 0x1f & uVar2) + iVar16;
        *_woffset = iVar14;
        uVar10 = 0;
        if ((int)uVar17 < 1) {
          uVar10 = uVar2;
        }
        uVar11 = uVar10 + uVar17;
        if ((int)uVar2 <= (int)(uVar10 + uVar17)) {
          uVar11 = uVar2;
        }
        *_outw = uVar11 - iVar14;
      }
      iVar14 = local_48[uVar13];
      if (uVar1 == 2) {
        if (iVar14 == 0) {
          if (iVar16 == -0xe9) {
            iVar16 = 0;
          }
          if (uVar17 == 0xffffff17) {
            uVar17 = uVar3;
          }
          iVar15 = (iVar16 >> 0x1f & uVar3) + iVar16;
          *_hoffset = iVar15;
          uVar10 = 0;
          if ((int)uVar17 < 1) {
            uVar10 = uVar3;
          }
          uVar11 = uVar10 + uVar17;
          if ((int)uVar3 <= (int)(uVar10 + uVar17)) {
            uVar11 = uVar3;
          }
          *_outh = uVar11 - iVar15;
        }
        if (iVar14 == 1) {
          if (iVar16 == -0xe9) {
            iVar16 = 0;
          }
          uVar10 = uVar2;
          if (uVar17 != 0xffffff17) {
            uVar10 = uVar17;
          }
          iVar15 = (iVar16 >> 0x1f & uVar2) + iVar16;
          *_woffset = iVar15;
          uVar17 = 0;
          if ((int)uVar10 < 1) {
            uVar17 = uVar2;
          }
          uVar11 = uVar17 + uVar10;
          if ((int)uVar2 <= (int)(uVar17 + uVar10)) {
            uVar11 = uVar2;
          }
          *_outw = uVar11 - iVar15;
          uVar17 = uVar10;
        }
      }
      if (uVar1 == 3) {
        if (iVar14 == 0) {
          iVar15 = 0;
          if (iVar16 != -0xe9) {
            iVar15 = iVar16;
          }
          iVar16 = iVar15;
          uVar10 = uVar5;
          if (uVar17 != 0xffffff17) {
            uVar10 = uVar17;
          }
          iVar15 = (iVar16 >> 0x1f & uVar5) + iVar16;
          *_coffset = iVar15;
          uVar17 = 0;
          if ((int)uVar10 < 1) {
            uVar17 = uVar5;
          }
          uVar11 = uVar17 + uVar10;
          if ((int)uVar5 <= (int)(uVar17 + uVar10)) {
            uVar11 = uVar5;
          }
          *_outc = uVar11 - iVar15;
          uVar17 = uVar10;
        }
        if (iVar14 == 1) {
          iVar15 = 0;
          if (iVar16 != -0xe9) {
            iVar15 = iVar16;
          }
          iVar16 = iVar15;
          uVar10 = uVar3;
          if (uVar17 != 0xffffff17) {
            uVar10 = uVar17;
          }
          iVar15 = (iVar16 >> 0x1f & uVar3) + iVar16;
          *_hoffset = iVar15;
          uVar17 = 0;
          if ((int)uVar10 < 1) {
            uVar17 = uVar3;
          }
          uVar11 = uVar17 + uVar10;
          if ((int)uVar3 <= (int)(uVar17 + uVar10)) {
            uVar11 = uVar3;
          }
          *_outh = uVar11 - iVar15;
          uVar17 = uVar10;
        }
        if (iVar14 == 2) {
          iVar15 = 0;
          if (iVar16 != -0xe9) {
            iVar15 = iVar16;
          }
          iVar16 = iVar15;
          uVar10 = uVar2;
          if (uVar17 != 0xffffff17) {
            uVar10 = uVar17;
          }
          uVar17 = uVar10;
          iVar15 = (iVar16 >> 0x1f & uVar2) + iVar16;
          *_woffset = iVar15;
          uVar10 = 0;
          if ((int)uVar17 < 1) {
            uVar10 = uVar2;
          }
          uVar11 = uVar10 + uVar17;
          if ((int)uVar2 <= (int)(uVar10 + uVar17)) {
            uVar11 = uVar2;
          }
          *_outw = uVar11 - iVar15;
        }
      }
      if (uVar1 == 4) {
        if (iVar14 == 0) {
          iVar15 = 0;
          if (iVar16 != -0xe9) {
            iVar15 = iVar16;
          }
          iVar16 = iVar15;
          uVar10 = uVar5;
          if (uVar17 != 0xffffff17) {
            uVar10 = uVar17;
          }
          iVar15 = (iVar16 >> 0x1f & uVar5) + iVar16;
          *_coffset = iVar15;
          uVar17 = 0;
          if ((int)uVar10 < 1) {
            uVar17 = uVar5;
          }
          uVar11 = uVar17 + uVar10;
          if ((int)uVar5 <= (int)(uVar17 + uVar10)) {
            uVar11 = uVar5;
          }
          *_outc = uVar11 - iVar15;
          uVar17 = uVar10;
        }
        if (iVar14 == 1) {
          iVar15 = 0;
          if (iVar16 != -0xe9) {
            iVar15 = iVar16;
          }
          iVar16 = iVar15;
          uVar10 = uVar4;
          if (uVar17 != 0xffffff17) {
            uVar10 = uVar17;
          }
          iVar15 = (iVar16 >> 0x1f & uVar4) + iVar16;
          *_doffset = iVar15;
          uVar17 = 0;
          if ((int)uVar10 < 1) {
            uVar17 = uVar4;
          }
          uVar11 = uVar17 + uVar10;
          if ((int)uVar4 <= (int)(uVar17 + uVar10)) {
            uVar11 = uVar4;
          }
          *_outd = uVar11 - iVar15;
          uVar17 = uVar10;
        }
        if (iVar14 == 2) {
          iVar15 = 0;
          if (iVar16 != -0xe9) {
            iVar15 = iVar16;
          }
          iVar16 = iVar15;
          uVar10 = uVar3;
          if (uVar17 != 0xffffff17) {
            uVar10 = uVar17;
          }
          iVar15 = (iVar16 >> 0x1f & uVar3) + iVar16;
          *_hoffset = iVar15;
          uVar17 = 0;
          if ((int)uVar10 < 1) {
            uVar17 = uVar3;
          }
          uVar11 = uVar17 + uVar10;
          if ((int)uVar3 <= (int)(uVar17 + uVar10)) {
            uVar11 = uVar3;
          }
          *_outh = uVar11 - iVar15;
          uVar17 = uVar10;
        }
        if (iVar14 == 3) {
          iVar14 = 0;
          if (iVar16 != -0xe9) {
            iVar14 = iVar16;
          }
          uVar10 = uVar2;
          if (uVar17 != 0xffffff17) {
            uVar10 = uVar17;
          }
          iVar14 = (iVar14 >> 0x1f & uVar2) + iVar14;
          *_woffset = iVar14;
          uVar17 = 0;
          if ((int)uVar10 < 1) {
            uVar17 = uVar2;
          }
          uVar11 = uVar17 + uVar10;
          if ((int)uVar2 <= (int)(uVar17 + uVar10)) {
            uVar11 = uVar2;
          }
          *_outw = uVar11 - iVar14;
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
    return;
  }
  *_woffset = this->woffset;
  *_hoffset = this->hoffset;
  *_doffset = this->doffset;
  *_coffset = this->coffset;
  *_outw = uVar2;
  *_outh = uVar3;
  *_outd = uVar4;
  *_outc = uVar5;
  switch(uVar1) {
  case 1:
    iVar16 = uVar2 - (this->woffset + this->woffset2);
    *_outw = iVar16;
    if (this->outw != -0xe9) {
      piVar9 = &this->outw;
      if (iVar16 < this->outw) {
        piVar9 = _outw;
      }
      *_outw = *piVar9;
    }
    if (uVar1 != 4) {
      if (uVar1 != 3) {
        if (uVar1 != 2) {
          return;
        }
        goto switchD_002687de_caseD_2;
      }
      goto switchD_002687de_caseD_3;
    }
    break;
  case 2:
switchD_002687de_caseD_2:
    iVar16 = uVar2 - (this->woffset + this->woffset2);
    *_outw = iVar16;
    if (this->outw != -0xe9) {
      piVar9 = &this->outw;
      if (iVar16 < this->outw) {
        piVar9 = _outw;
      }
      *_outw = *piVar9;
    }
    iVar16 = uVar3 - (this->hoffset + this->hoffset2);
    *_outh = iVar16;
    if (this->outh != -0xe9) {
      piVar9 = &this->outh;
      if (iVar16 < this->outh) {
        piVar9 = _outh;
      }
      *_outh = *piVar9;
    }
    if (uVar1 != 4) {
      if (uVar1 != 3) {
        return;
      }
      goto switchD_002687de_caseD_3;
    }
    break;
  case 3:
switchD_002687de_caseD_3:
    iVar16 = uVar2 - (this->woffset + this->woffset2);
    *_outw = iVar16;
    if (this->outw != -0xe9) {
      piVar9 = &this->outw;
      if (iVar16 < this->outw) {
        piVar9 = _outw;
      }
      *_outw = *piVar9;
    }
    iVar16 = uVar3 - (this->hoffset + this->hoffset2);
    *_outh = iVar16;
    if (this->outh != -0xe9) {
      piVar9 = &this->outh;
      if (iVar16 < this->outh) {
        piVar9 = _outh;
      }
      *_outh = *piVar9;
    }
    iVar16 = uVar5 - (this->coffset + this->coffset2);
    *_outc = iVar16;
    if (this->outc != -0xe9) {
      piVar9 = &this->outc;
      if (iVar16 < this->outc) {
        piVar9 = _outc;
      }
      *_outc = *piVar9;
    }
    if (uVar1 != 4) {
      return;
    }
    break;
  case 4:
    break;
  default:
    goto switchD_002687de_default;
  }
  iVar16 = uVar2 - (this->woffset + this->woffset2);
  *_outw = iVar16;
  if (this->outw != -0xe9) {
    piVar9 = &this->outw;
    if (iVar16 < this->outw) {
      piVar9 = _outw;
    }
    *_outw = *piVar9;
  }
  iVar16 = uVar3 - (this->hoffset + this->hoffset2);
  *_outh = iVar16;
  if (this->outh != -0xe9) {
    piVar9 = &this->outh;
    if (iVar16 < this->outh) {
      piVar9 = _outh;
    }
    *_outh = *piVar9;
  }
  iVar16 = uVar4 - (this->doffset + this->doffset2);
  *_outd = iVar16;
  if (this->outd != -0xe9) {
    piVar9 = &this->outd;
    if (iVar16 < this->outd) {
      piVar9 = _outd;
    }
    *_outd = *piVar9;
  }
  iVar16 = uVar5 - (this->coffset + this->coffset2);
  *_outc = iVar16;
  if (this->outc != -0xe9) {
    piVar9 = &this->outc;
    if (iVar16 < this->outc) {
      piVar9 = _outc;
    }
    *_outc = *piVar9;
  }
switchD_002687de_default:
  return;
}

Assistant:

void Crop::resolve_crop_roi(const Mat& bottom_blob, int& _woffset, int& _hoffset, int& _doffset, int& _coffset, int& _outw, int& _outh, int& _outd, int& _outc) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool numpy_style_slice = !starts.empty() && !ends.empty();
    if (numpy_style_slice)
    {
        _woffset = 0;
        _hoffset = 0;
        _doffset = 0;
        _coffset = 0;
        _outw = w;
        _outh = h;
        _outd = d;
        _outc = channels;

        const int* starts_ptr = starts;
        const int* ends_ptr = ends;
        const int* axes_ptr = axes;

        int _axes[4] = {0, 1, 2, 3};
        int num_axis = axes.w;
        if (num_axis == 0)
        {
            num_axis = dims;
        }
        else
        {
            for (int i = 0; i < num_axis; i++)
            {
                int axis = axes_ptr[i];
                if (axis < 0)
                    axis = dims + axis;
                _axes[i] = axis;
            }
        }

        for (int i = 0; i < num_axis; i++)
        {
            int axis = _axes[i];
            int start = starts_ptr[i];
            int end = ends_ptr[i];

            if (dims == 1) // axis == 0
            {
                if (start == -233) start = 0;
                if (end == -233) end = w;
                _woffset = start >= 0 ? start : w + start;
                _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
            }
            if (dims == 2)
            {
                if (axis == 0)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = h;
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
                }
                if (axis == 1)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = w;
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
            if (dims == 3)
            {
                if (axis == 0)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = channels;
                    _coffset = start >= 0 ? start : channels + start;
                    _outc = std::min(channels, end > 0 ? end : channels + end) - _coffset;
                }
                if (axis == 1)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = h;
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
                }
                if (axis == 2)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = w;
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
            if (dims == 4)
            {
                if (axis == 0)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = channels;
                    _coffset = start >= 0 ? start : channels + start;
                    _outc = std::min(channels, end > 0 ? end : channels + end) - _coffset;
                }
                if (axis == 1)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = d;
                    _doffset = start >= 0 ? start : d + start;
                    _outd = std::min(d, end > 0 ? end : d + end) - _doffset;
                }
                if (axis == 2)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = h;
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
                }
                if (axis == 3)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = w;
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
        }
    }
    else
    {
        _woffset = woffset;
        _hoffset = hoffset;
        _doffset = doffset;
        _coffset = coffset;
        _outw = w;
        _outh = h;
        _outd = d;
        _outc = channels;

        if (dims == 1)
        {
            _outw = w - woffset - woffset2;
            if (outw != -233)
                _outw = std::min(outw, _outw);
        }
        if (dims == 2)
        {
            _outw = w - woffset - woffset2;
            if (outw != -233)
                _outw = std::min(outw, _outw);

            _outh = h - hoffset - hoffset2;
            if (outh != -233)
                _outh = std::min(outh, _outh);
        }
        if (dims == 3)
        {
            _outw = w - woffset - woffset2;
            if (outw != -233)
                _outw = std::min(outw, _outw);

            _outh = h - hoffset - hoffset2;
            if (outh != -233)
                _outh = std::min(outh, _outh);

            _outc = channels - coffset - coffset2;
            if (outc != -233)
                _outc = std::min(outc, _outc);
        }
        if (dims == 4)
        {
            _outw = w - woffset - woffset2;
            if (outw != -233)
                _outw = std::min(outw, _outw);

            _outh = h - hoffset - hoffset2;
            if (outh != -233)
                _outh = std::min(outh, _outh);

            _outd = d - doffset - doffset2;
            if (outd != -233)
                _outd = std::min(outd, _outd);

            _outc = channels - coffset - coffset2;
            if (outc != -233)
                _outc = std::min(outc, _outc);
        }
    }
}